

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>::
destroy(AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo> *this
       )

{
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo> *this_local
  ;
  
  freePromise<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>>
            (this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }